

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  StackItemT<embree::NodeRefPtr<4>_> *pSVar1;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar2;
  float *pfVar3;
  AccelData *pAVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [12];
  size_t sVar14;
  undefined8 uVar15;
  undefined4 in_EAX;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  Geometry *pGVar21;
  _func_int **pp_Var22;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar23;
  undefined4 uVar24;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar25;
  ulong uVar26;
  Geometry *pGVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  NodeRef nodeRef;
  ulong uVar31;
  float fVar63;
  float fVar65;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint uVar64;
  uint uVar66;
  float fVar67;
  uint uVar68;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar69;
  uint uVar70;
  float fVar75;
  float fVar78;
  vint4 bi;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar76;
  uint uVar77;
  uint uVar79;
  float fVar80;
  uint uVar81;
  undefined1 auVar74 [16];
  vint4 bi_1;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar86;
  undefined1 auVar85 [16];
  float fVar87;
  float fVar99;
  float fVar100;
  vint4 ai;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar101;
  undefined1 auVar98 [16];
  float fVar102;
  float fVar105;
  float fVar106;
  vint4 ai_1;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar107;
  float fVar108;
  float fVar110;
  float fVar111;
  vint4 ai_3;
  undefined1 auVar109 [16];
  float fVar112;
  float fVar113;
  float fVar117;
  float fVar118;
  vint4 bi_4;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar119;
  uint uVar120;
  float fVar123;
  float fVar125;
  vint4 bi_3;
  float fVar127;
  undefined1 auVar121 [16];
  uint uVar124;
  uint uVar126;
  uint uVar128;
  undefined1 auVar122 [16];
  uint uVar129;
  uint uVar133;
  uint uVar134;
  vint4 ai_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  uint uVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  vint<4> octant;
  vint4 bi_9;
  RTCIntersectFunctionNArguments local_11a8;
  Geometry *local_1178;
  undefined8 local_1170;
  RTCIntersectArguments *local_1168;
  undefined1 local_1158 [16];
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  undefined1 local_1138 [16];
  vfloat<4> fmin;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  undefined1 local_1038 [8];
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [8];
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  ai.field_0.i[2] = 0xffffffff;
  ai.field_0.v[0] = 0xffffffffffffffff;
  ai.field_0.i[3] = 0xffffffff;
  auVar82._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
  auVar82._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
  auVar82._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
  auVar82._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
  uVar16 = movmskps(in_EAX,auVar82);
  if (uVar16 == 0) {
    return;
  }
  pAVar4 = This->ptr;
  pSVar25 = (StackItemT<embree::NodeRefPtr<4>_> *)(ulong)(uVar16 & 0xff);
  fVar139 = *(float *)ray;
  fVar140 = *(float *)(ray + 4);
  fVar141 = *(float *)(ray + 8);
  fVar142 = *(float *)(ray + 0xc);
  fVar143 = *(float *)(ray + 0x10);
  fVar144 = *(float *)(ray + 0x14);
  fVar145 = *(float *)(ray + 0x18);
  fVar146 = *(float *)(ray + 0x1c);
  fVar147 = *(float *)(ray + 0x20);
  fVar148 = *(float *)(ray + 0x24);
  fVar149 = *(float *)(ray + 0x28);
  fVar150 = *(float *)(ray + 0x2c);
  auVar84 = *(undefined1 (*) [16])(ray + 0x40);
  fVar119 = (float)DAT_01f4bd50;
  fVar123 = DAT_01f4bd50._4_4_;
  fVar125 = DAT_01f4bd50._8_4_;
  fVar127 = DAT_01f4bd50._12_4_;
  auVar91._4_4_ = -(uint)(ABS(auVar84._4_4_) < fVar123);
  auVar91._0_4_ = -(uint)(ABS(auVar84._0_4_) < fVar119);
  auVar91._8_4_ = -(uint)(ABS(auVar84._8_4_) < fVar125);
  auVar91._12_4_ = -(uint)(ABS(auVar84._12_4_) < fVar127);
  auVar130 = blendvps(auVar84,_DAT_01f4bd50,auVar91);
  auVar91 = *(undefined1 (*) [16])(ray + 0x50);
  auVar97._4_4_ = -(uint)(ABS(auVar91._4_4_) < fVar123);
  auVar97._0_4_ = -(uint)(ABS(auVar91._0_4_) < fVar119);
  auVar97._8_4_ = -(uint)(ABS(auVar91._8_4_) < fVar125);
  auVar97._12_4_ = -(uint)(ABS(auVar91._12_4_) < fVar127);
  auVar136 = blendvps(auVar91,_DAT_01f4bd50,auVar97);
  auVar97 = *(undefined1 (*) [16])(ray + 0x60);
  auVar151._4_4_ = -(uint)(ABS(auVar97._4_4_) < fVar123);
  auVar151._0_4_ = -(uint)(ABS(auVar97._0_4_) < fVar119);
  auVar151._8_4_ = -(uint)(ABS(auVar97._8_4_) < fVar125);
  auVar151._12_4_ = -(uint)(ABS(auVar97._12_4_) < fVar127);
  auVar138 = blendvps(auVar97,_DAT_01f4bd50,auVar151);
  auVar32 = rcpps(auVar151,auVar130);
  fVar119 = auVar32._0_4_;
  fVar123 = auVar32._4_4_;
  fVar125 = auVar32._8_4_;
  fVar75 = auVar32._12_4_;
  auVar137._4_4_ = (1.0 - auVar130._4_4_ * fVar123) * fVar123 + fVar123;
  auVar137._0_4_ = (1.0 - auVar130._0_4_ * fVar119) * fVar119 + fVar119;
  auVar32 = rcpps(auVar32,auVar136);
  fVar119 = auVar32._0_4_;
  fVar123 = auVar32._4_4_;
  fVar127 = auVar32._8_4_;
  fVar63 = auVar32._12_4_;
  auVar137._8_4_ = (1.0 - auVar130._8_4_ * fVar125) * fVar125 + fVar125;
  auVar137._12_4_ = (1.0 - auVar130._12_4_ * fVar75) * fVar75 + fVar75;
  local_10a8._0_8_ =
       CONCAT44((1.0 - auVar136._4_4_ * fVar123) * fVar123 + fVar123,
                (1.0 - auVar136._0_4_ * fVar119) * fVar119 + fVar119);
  local_10a8._8_4_ = (1.0 - auVar136._8_4_ * fVar127) * fVar127 + fVar127;
  local_10a8._12_4_ = (1.0 - auVar136._12_4_ * fVar63) * fVar63 + fVar63;
  auVar32 = rcpps(auVar32,auVar138);
  fVar119 = auVar32._0_4_;
  fVar123 = auVar32._4_4_;
  fVar125 = auVar32._8_4_;
  fVar127 = auVar32._12_4_;
  auVar32._8_4_ = local_10a8._8_4_;
  auVar32._0_8_ = local_10a8._0_8_;
  auVar32._12_4_ = local_10a8._12_4_;
  fVar119 = (1.0 - auVar138._0_4_ * fVar119) * fVar119 + fVar119;
  fVar123 = (1.0 - auVar138._4_4_ * fVar123) * fVar123 + fVar123;
  fVar125 = (1.0 - auVar138._8_4_ * fVar125) * fVar125 + fVar125;
  fVar127 = (1.0 - auVar138._12_4_ * fVar127) * fVar127 + fVar127;
  auVar130._0_12_ = ZEXT812(0);
  auVar130._12_4_ = 0;
  auVar151 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar130);
  auVar136._0_8_ = CONCAT44(-(uint)(auVar84._4_4_ < 0.0),-(uint)(auVar84._0_4_ < 0.0)) & 0x100000001
  ;
  auVar136._8_4_ = -(uint)(auVar84._8_4_ < 0.0) & 1;
  auVar136._12_4_ = -(uint)(auVar84._12_4_ < 0.0) & 1;
  local_10b8 = maxps(*(undefined1 (*) [16])(ray + 0x80),auVar130);
  auVar84._0_8_ = CONCAT44(-(uint)(auVar91._4_4_ < 0.0),-(uint)(auVar91._0_4_ < 0.0)) & 0x200000002;
  auVar84._8_4_ = -(uint)(auVar91._8_4_ < 0.0) & 2;
  auVar84._12_4_ = -(uint)(auVar91._12_4_ < 0.0) & 2;
  auVar138._0_8_ = CONCAT44(-(uint)(auVar97._4_4_ < 0.0),-(uint)(auVar97._0_4_ < 0.0)) & 0x400000004
  ;
  auVar138._8_4_ = -(uint)(auVar97._8_4_ < 0.0) & 4;
  auVar138._12_4_ = -(uint)(auVar97._12_4_ < 0.0) & 4;
  local_10c8 = auVar82 ^ (undefined1  [16])ai.field_0 | auVar138 | auVar84 | auVar136;
  local_1058 = fVar139;
  fStack_1054 = fVar140;
  fStack_1050 = fVar141;
  fStack_104c = fVar142;
  local_1068 = fVar143;
  fStack_1064 = fVar144;
  fStack_1060 = fVar145;
  fStack_105c = fVar146;
  local_1078 = fVar147;
  fStack_1074 = fVar148;
  fStack_1070 = fVar149;
  fStack_106c = fVar150;
  local_1088 = fVar119;
  fStack_1084 = fVar123;
  fStack_1080 = fVar125;
  fStack_107c = fVar127;
  local_1098 = auVar137;
LAB_0072fedd:
  lVar5 = 0;
  if (pSVar25 != (StackItemT<embree::NodeRefPtr<4>_> *)0x0) {
    for (; ((ulong)pSVar25 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
    }
  }
  iVar17 = *(int *)(local_10c8 + lVar5 * 4);
  auVar71._0_8_ = CONCAT44(-(uint)(iVar17 == local_10c8._4_4_),-(uint)(iVar17 == local_10c8._0_4_));
  auVar71._8_4_ = -(uint)(iVar17 == local_10c8._8_4_);
  auVar71._12_4_ = -(uint)(iVar17 == local_10c8._12_4_);
  uVar24 = movmskps((int)lVar5,auVar71);
  pSVar25 = (StackItemT<embree::NodeRefPtr<4>_> *)
            (~CONCAT44((int)((ulong)lVar5 >> 0x20),uVar24) & (ulong)pSVar25);
  auVar33._8_4_ = auVar71._8_4_;
  auVar33._0_8_ = auVar71._0_8_;
  auVar33._12_4_ = auVar71._12_4_;
  auVar132._4_4_ = fVar140;
  auVar132._0_4_ = fVar139;
  auVar132._8_4_ = fVar141;
  auVar132._12_4_ = fVar142;
  auVar82 = blendvps(_DAT_01f45a30,auVar132,auVar33);
  auVar34._4_4_ = auVar82._0_4_;
  auVar34._0_4_ = auVar82._4_4_;
  auVar34._8_4_ = auVar82._12_4_;
  auVar34._12_4_ = auVar82._8_4_;
  auVar82 = minps(auVar34,auVar82);
  auVar83._0_8_ = auVar82._8_8_;
  auVar83._8_4_ = auVar82._0_4_;
  auVar83._12_4_ = auVar82._4_4_;
  auVar84 = minps(auVar83,auVar82);
  auVar35._8_4_ = auVar71._8_4_;
  auVar35._0_8_ = auVar71._0_8_;
  auVar35._12_4_ = auVar71._12_4_;
  auVar7._4_4_ = fVar144;
  auVar7._0_4_ = fVar143;
  auVar7._8_4_ = fVar145;
  auVar7._12_4_ = fVar146;
  auVar82 = blendvps(_DAT_01f45a30,auVar7,auVar35);
  auVar36._4_4_ = auVar82._0_4_;
  auVar36._0_4_ = auVar82._4_4_;
  auVar36._8_4_ = auVar82._12_4_;
  auVar36._12_4_ = auVar82._8_4_;
  auVar82 = minps(auVar36,auVar82);
  auVar88._0_8_ = auVar82._8_8_;
  auVar88._8_4_ = auVar82._0_4_;
  auVar88._12_4_ = auVar82._4_4_;
  auVar82 = minps(auVar88,auVar82);
  auVar84 = insertps(auVar84,auVar82,0x1c);
  auVar37._8_4_ = auVar71._8_4_;
  auVar37._0_8_ = auVar71._0_8_;
  auVar37._12_4_ = auVar71._12_4_;
  auVar9._4_4_ = fVar148;
  auVar9._0_4_ = fVar147;
  auVar9._8_4_ = fVar149;
  auVar9._12_4_ = fVar150;
  auVar82 = blendvps(_DAT_01f45a30,auVar9,auVar37);
  auVar38._4_4_ = auVar82._0_4_;
  auVar38._0_4_ = auVar82._4_4_;
  auVar38._8_4_ = auVar82._12_4_;
  auVar38._12_4_ = auVar82._8_4_;
  auVar82 = minps(auVar38,auVar82);
  auVar89._0_8_ = auVar82._8_8_;
  auVar89._8_4_ = auVar82._0_4_;
  auVar89._12_4_ = auVar82._4_4_;
  auVar82 = minps(auVar89,auVar82);
  auVar84 = insertps(auVar84,auVar82,0x20);
  auVar39._8_4_ = auVar71._8_4_;
  auVar39._0_8_ = auVar71._0_8_;
  auVar39._12_4_ = auVar71._12_4_;
  auVar6._4_4_ = fVar140;
  auVar6._0_4_ = fVar139;
  auVar6._8_4_ = fVar141;
  auVar6._12_4_ = fVar142;
  auVar82 = blendvps(_DAT_01f45a40,auVar6,auVar39);
  auVar40._4_4_ = auVar82._0_4_;
  auVar40._0_4_ = auVar82._4_4_;
  auVar40._8_4_ = auVar82._12_4_;
  auVar40._12_4_ = auVar82._8_4_;
  auVar82 = maxps(auVar40,auVar82);
  auVar90._0_8_ = auVar82._8_8_;
  auVar90._8_4_ = auVar82._0_4_;
  auVar90._12_4_ = auVar82._4_4_;
  auVar91 = maxps(auVar90,auVar82);
  auVar41._8_4_ = auVar71._8_4_;
  auVar41._0_8_ = auVar71._0_8_;
  auVar41._12_4_ = auVar71._12_4_;
  auVar8._4_4_ = fVar144;
  auVar8._0_4_ = fVar143;
  auVar8._8_4_ = fVar145;
  auVar8._12_4_ = fVar146;
  auVar82 = blendvps(_DAT_01f45a40,auVar8,auVar41);
  auVar42._4_4_ = auVar82._0_4_;
  auVar42._0_4_ = auVar82._4_4_;
  auVar42._8_4_ = auVar82._12_4_;
  auVar42._12_4_ = auVar82._8_4_;
  auVar82 = maxps(auVar42,auVar82);
  auVar92._0_8_ = auVar82._8_8_;
  auVar92._8_4_ = auVar82._0_4_;
  auVar92._12_4_ = auVar82._4_4_;
  auVar82 = maxps(auVar92,auVar82);
  auVar91 = insertps(auVar91,auVar82,0x1c);
  auVar43._8_4_ = auVar71._8_4_;
  auVar43._0_8_ = auVar71._0_8_;
  auVar43._12_4_ = auVar71._12_4_;
  auVar10._4_4_ = fVar148;
  auVar10._0_4_ = fVar147;
  auVar10._8_4_ = fVar149;
  auVar10._12_4_ = fVar150;
  auVar82 = blendvps(_DAT_01f45a40,auVar10,auVar43);
  auVar44._4_4_ = auVar82._0_4_;
  auVar44._0_4_ = auVar82._4_4_;
  auVar44._8_4_ = auVar82._12_4_;
  auVar44._12_4_ = auVar82._8_4_;
  auVar82 = maxps(auVar44,auVar82);
  auVar93._0_8_ = auVar82._8_8_;
  auVar93._8_4_ = auVar82._0_4_;
  auVar93._12_4_ = auVar82._4_4_;
  auVar82 = maxps(auVar93,auVar82);
  auVar130 = insertps(auVar91,auVar82,0x20);
  auVar45._8_4_ = auVar71._8_4_;
  auVar45._0_8_ = auVar71._0_8_;
  auVar45._12_4_ = auVar71._12_4_;
  auVar82 = blendvps(_DAT_01f45a30,auVar137,auVar45);
  auVar46._4_4_ = auVar82._0_4_;
  auVar46._0_4_ = auVar82._4_4_;
  auVar46._8_4_ = auVar82._12_4_;
  auVar46._12_4_ = auVar82._8_4_;
  auVar82 = minps(auVar46,auVar82);
  auVar131._0_8_ = auVar82._8_8_;
  auVar131._8_4_ = auVar82._0_4_;
  auVar131._12_4_ = auVar82._4_4_;
  auVar91 = minps(auVar131,auVar82);
  auVar47._8_4_ = auVar71._8_4_;
  auVar47._0_8_ = auVar71._0_8_;
  auVar47._12_4_ = auVar71._12_4_;
  auVar82 = blendvps(_DAT_01f45a30,auVar32,auVar47);
  auVar48._4_4_ = auVar82._0_4_;
  auVar48._0_4_ = auVar82._4_4_;
  auVar48._8_4_ = auVar82._12_4_;
  auVar48._12_4_ = auVar82._8_4_;
  auVar82 = minps(auVar48,auVar82);
  auVar94._0_8_ = auVar82._8_8_;
  auVar94._8_4_ = auVar82._0_4_;
  auVar94._12_4_ = auVar82._4_4_;
  auVar82 = minps(auVar94,auVar82);
  auVar91 = insertps(auVar91,auVar82,0x1c);
  auVar49._8_4_ = auVar71._8_4_;
  auVar49._0_8_ = auVar71._0_8_;
  auVar49._12_4_ = auVar71._12_4_;
  auVar11._4_4_ = fVar123;
  auVar11._0_4_ = fVar119;
  auVar11._8_4_ = fVar125;
  auVar11._12_4_ = fVar127;
  auVar82 = blendvps(_DAT_01f45a30,auVar11,auVar49);
  auVar50._4_4_ = auVar82._0_4_;
  auVar50._0_4_ = auVar82._4_4_;
  auVar50._8_4_ = auVar82._12_4_;
  auVar50._12_4_ = auVar82._8_4_;
  auVar82 = minps(auVar50,auVar82);
  auVar95._0_8_ = auVar82._8_8_;
  auVar95._8_4_ = auVar82._0_4_;
  auVar95._12_4_ = auVar82._4_4_;
  auVar82 = minps(auVar95,auVar82);
  auVar132 = insertps(auVar91,auVar82,0x20);
  auVar51._8_4_ = auVar71._8_4_;
  auVar51._0_8_ = auVar71._0_8_;
  auVar51._12_4_ = auVar71._12_4_;
  auVar82 = blendvps(_DAT_01f45a40,auVar137,auVar51);
  auVar52._4_4_ = auVar82._0_4_;
  auVar52._0_4_ = auVar82._4_4_;
  auVar52._8_4_ = auVar82._12_4_;
  auVar52._12_4_ = auVar82._8_4_;
  auVar82 = maxps(auVar52,auVar82);
  auVar121._0_8_ = auVar82._8_8_;
  auVar121._8_4_ = auVar82._0_4_;
  auVar121._12_4_ = auVar82._4_4_;
  auVar91 = maxps(auVar121,auVar82);
  auVar53._8_4_ = auVar71._8_4_;
  auVar53._0_8_ = auVar71._0_8_;
  auVar53._12_4_ = auVar71._12_4_;
  auVar82 = blendvps(_DAT_01f45a40,auVar32,auVar53);
  auVar54._4_4_ = auVar82._0_4_;
  auVar54._0_4_ = auVar82._4_4_;
  auVar54._8_4_ = auVar82._12_4_;
  auVar54._12_4_ = auVar82._8_4_;
  auVar82 = maxps(auVar54,auVar82);
  auVar103._0_8_ = auVar82._8_8_;
  auVar103._8_4_ = auVar82._0_4_;
  auVar103._12_4_ = auVar82._4_4_;
  auVar82 = maxps(auVar103,auVar82);
  auVar91 = insertps(auVar91,auVar82,0x1c);
  auVar55._8_4_ = auVar71._8_4_;
  auVar55._0_8_ = auVar71._0_8_;
  auVar55._12_4_ = auVar71._12_4_;
  auVar12._4_4_ = fVar123;
  auVar12._0_4_ = fVar119;
  auVar12._8_4_ = fVar125;
  auVar12._12_4_ = fVar127;
  auVar82 = blendvps(_DAT_01f45a40,auVar12,auVar55);
  auVar56._4_4_ = auVar82._0_4_;
  auVar56._0_4_ = auVar82._4_4_;
  auVar56._8_4_ = auVar82._12_4_;
  auVar56._12_4_ = auVar82._8_4_;
  auVar82 = maxps(auVar56,auVar82);
  auVar104._0_8_ = auVar82._8_8_;
  auVar104._8_4_ = auVar82._0_4_;
  auVar104._12_4_ = auVar82._4_4_;
  auVar82 = maxps(auVar104,auVar82);
  auVar138 = insertps(auVar91,auVar82,0x20);
  auVar57._8_4_ = auVar71._8_4_;
  auVar57._0_8_ = auVar71._0_8_;
  auVar57._12_4_ = auVar71._12_4_;
  auVar82 = blendvps(_DAT_01f45a30,auVar151,auVar57);
  auVar96._4_4_ = auVar82._0_4_;
  auVar96._0_4_ = auVar82._4_4_;
  auVar96._8_4_ = auVar82._12_4_;
  auVar96._12_4_ = auVar82._8_4_;
  bi_9.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 blendvps(_DAT_01f45a40,local_10b8,auVar57);
  auVar91 = minps(auVar96,auVar82);
  auVar58._4_4_ = -(uint)(0.0 <= auVar132._4_4_);
  auVar58._0_4_ = -(uint)(0.0 <= auVar132._0_4_);
  auVar58._8_4_ = -(uint)(0.0 <= auVar132._8_4_);
  auVar58._12_4_ = -(uint)(0.0 <= auVar132._12_4_);
  auVar97 = blendvps(auVar138,auVar132,auVar58);
  auVar136 = blendvps(auVar84,auVar130,auVar58);
  auVar109._4_4_ = bi_9.field_0._0_4_;
  auVar109._0_4_ = bi_9.field_0._4_4_;
  auVar109._8_4_ = bi_9.field_0._12_4_;
  auVar109._12_4_ = bi_9.field_0._8_4_;
  auVar82 = blendvps(auVar130,auVar84,auVar58);
  auVar84 = maxps(auVar109,(undefined1  [16])bi_9.field_0);
  local_fc8 = auVar97._0_4_;
  local_fe8 = auVar97._4_4_;
  uVar30 = (ulong)(local_fe8 < 0.0) << 4 | 0x20;
  fStack_fa0 = auVar97._8_4_;
  auVar114._8_8_ = auVar84._8_8_;
  auVar114._0_8_ = auVar114._8_8_;
  uVar31 = (ulong)(fStack_fa0 < 0.0) << 4 | 0x40;
  if (auVar84._8_4_ <= auVar84._0_4_) {
    auVar114._0_4_ = auVar84._0_4_;
  }
  auVar84 = blendvps(auVar132,auVar138,auVar58);
  local_fd8 = auVar136._0_4_ * local_fc8;
  local_ff8 = auVar136._4_4_ * local_fe8;
  local_fb8 = auVar136._8_4_ * fStack_fa0;
  local_1008 = auVar84._0_4_;
  local_1018 = auVar82._0_4_ * local_1008;
  local_1028 = auVar84._4_4_;
  fVar75 = auVar82._4_4_ * local_1028;
  local_f98 = auVar84._8_4_;
  fStack_1144 = auVar82._8_4_ * local_f98;
  uVar29 = (ulong)(local_fc8 < 0.0) * 0x10;
  stack[0].ptr.ptr = *(size_t *)&pAVar4[1].bounds.bounds0.lower.field_0;
  stack[0].dist = 0;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  local_fa8._4_4_ = fStack_fa0;
  local_fa8._0_4_ = fStack_fa0;
  fStack_f9c = fStack_fa0;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  local_1158._0_4_ = auVar91._0_4_;
  local_1158._8_4_ = auVar91._8_4_;
  auVar59._4_4_ = local_1158._0_4_;
  auVar59._0_4_ = local_1158._0_4_;
  auVar59._8_4_ = local_1158._0_4_;
  auVar59._12_4_ = local_1158._0_4_;
  auVar72._4_4_ = local_1158._8_4_;
  auVar72._0_4_ = local_1158._8_4_;
  auVar72._8_4_ = local_1158._8_4_;
  auVar72._12_4_ = local_1158._8_4_;
  local_1158 = minps(auVar72,auVar59);
  local_1138 = blendvps(_DAT_01f45a30,auVar151,auVar71);
  local_1038._4_4_ = fVar75;
  local_1038._0_4_ = fVar75;
  fStack_1030 = fVar75;
  fStack_102c = fVar75;
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  local_1148 = fStack_1144;
  fStack_1140 = fStack_1144;
  fStack_113c = fStack_1144;
  pSVar23 = stack + 1;
  local_11a8.context = (RTCRayQueryContext *)pSVar25;
  do {
    auVar115._0_4_ = auVar114._0_4_;
    auVar115._4_4_ = auVar115._0_4_;
    auVar115._8_4_ = auVar115._0_4_;
    auVar115._12_4_ = auVar115._0_4_;
    local_f88 = auVar115;
LAB_007302db:
    do {
      do {
        do {
          if (pSVar23 == stack) {
            if (pSVar25 == (StackItemT<embree::NodeRefPtr<4>_> *)0x0) {
              return;
            }
            goto LAB_0072fedd;
          }
          fVar75 = (float)pSVar23[-1].dist;
          pSVar23 = pSVar23 + -1;
          auVar152._4_4_ = fVar75;
          auVar152._0_4_ = fVar75;
          auVar152._8_4_ = fVar75;
          auVar152._12_4_ = fVar75;
          auVar73._4_4_ = -(uint)(fVar75 < (float)bi_9.field_0.i[1]);
          auVar73._0_4_ = -(uint)(fVar75 < (float)bi_9.field_0.i[0]);
          auVar73._8_4_ = -(uint)(fVar75 < (float)bi_9.field_0.i[2]);
          auVar73._12_4_ = -(uint)(fVar75 < (float)bi_9.field_0.i[3]);
          iVar17 = movmskps((int)stack,auVar73);
        } while (iVar17 == 0);
        uVar18 = (pSVar23->ptr).ptr;
        while ((uVar18 & 8) == 0) {
          pfVar3 = (float *)(uVar18 + 0x20 + uVar29);
          fVar75 = *pfVar3 * local_fc8 - local_fd8;
          fVar63 = pfVar3[1] * fStack_fc4 - fStack_fd4;
          fVar65 = pfVar3[2] * fStack_fc0 - fStack_fd0;
          fVar67 = pfVar3[3] * fStack_fbc - fStack_fcc;
          pfVar3 = (float *)(uVar18 + 0x20 + uVar30);
          fVar69 = *pfVar3 * local_fe8 - local_ff8;
          fVar76 = pfVar3[1] * fStack_fe4 - fStack_ff4;
          fVar78 = pfVar3[2] * fStack_fe0 - fStack_ff0;
          fVar80 = pfVar3[3] * fStack_fdc - fStack_fec;
          uVar70 = (uint)((int)fVar69 < (int)fVar75) * (int)fVar75 |
                   (uint)((int)fVar69 >= (int)fVar75) * (int)fVar69;
          uVar77 = (uint)((int)fVar76 < (int)fVar63) * (int)fVar63 |
                   (uint)((int)fVar76 >= (int)fVar63) * (int)fVar76;
          uVar79 = (uint)((int)fVar78 < (int)fVar65) * (int)fVar65 |
                   (uint)((int)fVar78 >= (int)fVar65) * (int)fVar78;
          uVar81 = (uint)((int)fVar80 < (int)fVar67) * (int)fVar67 |
                   (uint)((int)fVar80 >= (int)fVar67) * (int)fVar80;
          pfVar3 = (float *)(uVar18 + 0x20 + uVar31);
          fVar75 = *pfVar3 * (float)local_fa8._0_4_ - local_fb8;
          fVar63 = pfVar3[1] * (float)local_fa8._4_4_ - fStack_fb4;
          fVar65 = pfVar3[2] * fStack_fa0 - fStack_fb0;
          fVar67 = pfVar3[3] * fStack_f9c - fStack_fac;
          uVar16 = (uint)((int)fVar75 < (int)local_1158._0_4_) * local_1158._0_4_ |
                   (uint)((int)fVar75 >= (int)local_1158._0_4_) * (int)fVar75;
          uVar64 = (uint)((int)fVar63 < (int)local_1158._4_4_) * local_1158._4_4_ |
                   (uint)((int)fVar63 >= (int)local_1158._4_4_) * (int)fVar63;
          uVar66 = (uint)((int)fVar65 < (int)local_1158._8_4_) * local_1158._8_4_ |
                   (uint)((int)fVar65 >= (int)local_1158._8_4_) * (int)fVar65;
          uVar68 = (uint)((int)fVar67 < (int)local_1158._12_4_) * local_1158._12_4_ |
                   (uint)((int)fVar67 >= (int)local_1158._12_4_) * (int)fVar67;
          fmin.field_0.i[0] =
               ((int)uVar16 < (int)uVar70) * uVar70 | ((int)uVar16 >= (int)uVar70) * uVar16;
          fmin.field_0.i[1] =
               ((int)uVar64 < (int)uVar77) * uVar77 | ((int)uVar64 >= (int)uVar77) * uVar64;
          fmin.field_0.i[2] =
               ((int)uVar66 < (int)uVar79) * uVar79 | ((int)uVar66 >= (int)uVar79) * uVar66;
          fmin.field_0.i[3] =
               ((int)uVar68 < (int)uVar81) * uVar81 | ((int)uVar68 >= (int)uVar81) * uVar68;
          pfVar3 = (float *)(uVar18 + 0x20 + (uVar29 ^ 0x10));
          fVar75 = *pfVar3 * local_1008 - local_1018;
          fVar63 = pfVar3[1] * fStack_1004 - fStack_1014;
          fVar65 = pfVar3[2] * fStack_1000 - fStack_1010;
          fVar67 = pfVar3[3] * fStack_ffc - fStack_100c;
          pfVar3 = (float *)(uVar18 + 0x20 + (uVar30 ^ 0x10));
          fVar69 = *pfVar3 * local_1028 - (float)local_1038._0_4_;
          fVar76 = pfVar3[1] * fStack_1024 - (float)local_1038._4_4_;
          fVar78 = pfVar3[2] * fStack_1020 - fStack_1030;
          fVar80 = pfVar3[3] * fStack_101c - fStack_102c;
          uVar70 = (uint)((int)fVar75 < (int)fVar69) * (int)fVar75 |
                   (uint)((int)fVar75 >= (int)fVar69) * (int)fVar69;
          uVar77 = (uint)((int)fVar63 < (int)fVar76) * (int)fVar63 |
                   (uint)((int)fVar63 >= (int)fVar76) * (int)fVar76;
          uVar79 = (uint)((int)fVar65 < (int)fVar78) * (int)fVar65 |
                   (uint)((int)fVar65 >= (int)fVar78) * (int)fVar78;
          uVar81 = (uint)((int)fVar67 < (int)fVar80) * (int)fVar67 |
                   (uint)((int)fVar67 >= (int)fVar80) * (int)fVar80;
          pfVar3 = (float *)(uVar18 + 0x20 + (uVar31 ^ 0x10));
          fVar75 = *pfVar3 * local_f98 - local_1148;
          fVar63 = pfVar3[1] * fStack_f94 - fStack_1144;
          fVar65 = pfVar3[2] * fStack_f90 - fStack_1140;
          fVar67 = pfVar3[3] * fStack_f8c - fStack_113c;
          uVar16 = (uint)((int)local_f88._0_4_ < (int)fVar75) * local_f88._0_4_ |
                   (uint)((int)local_f88._0_4_ >= (int)fVar75) * (int)fVar75;
          uVar64 = (uint)((int)local_f88._4_4_ < (int)fVar63) * local_f88._4_4_ |
                   (uint)((int)local_f88._4_4_ >= (int)fVar63) * (int)fVar63;
          uVar66 = (uint)((int)local_f88._8_4_ < (int)fVar65) * local_f88._8_4_ |
                   (uint)((int)local_f88._8_4_ >= (int)fVar65) * (int)fVar65;
          uVar68 = (uint)((int)local_f88._12_4_ < (int)fVar67) * local_f88._12_4_ |
                   (uint)((int)local_f88._12_4_ >= (int)fVar67) * (int)fVar67;
          auVar60._4_4_ =
               -(uint)(fmin.field_0.v[1] <=
                      (float)(((int)uVar77 < (int)uVar64) * uVar77 |
                             ((int)uVar77 >= (int)uVar64) * uVar64));
          auVar60._0_4_ =
               -(uint)(fmin.field_0.v[0] <=
                      (float)(((int)uVar70 < (int)uVar16) * uVar70 |
                             ((int)uVar70 >= (int)uVar16) * uVar16));
          auVar60._8_4_ =
               -(uint)(fmin.field_0.v[2] <=
                      (float)(((int)uVar79 < (int)uVar66) * uVar79 |
                             ((int)uVar79 >= (int)uVar66) * uVar66));
          auVar60._12_4_ =
               -(uint)(fmin.field_0.v[3] <=
                      (float)(((int)uVar81 < (int)uVar68) * uVar81 |
                             ((int)uVar81 >= (int)uVar68) * uVar68));
          uVar16 = movmskps((int)uVar30,auVar60);
          if (uVar16 == 0) goto LAB_007302db;
          uVar28 = (ulong)(uVar16 & 0xff);
          uVar26 = 0;
          uVar19 = 8;
          auVar152 = _DAT_01f45a30;
          do {
            lVar5 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            fVar75 = *(float *)(uVar18 + 0x20 + lVar5 * 4);
            fVar63 = *(float *)(uVar18 + 0x30 + lVar5 * 4);
            fVar65 = *(float *)(uVar18 + 0x40 + lVar5 * 4);
            fVar67 = *(float *)(uVar18 + 0x50 + lVar5 * 4);
            fVar87 = (fVar75 - fVar139) * auVar137._0_4_;
            fVar99 = (fVar75 - fVar140) * auVar137._4_4_;
            fVar100 = (fVar75 - fVar141) * auVar137._8_4_;
            fVar101 = (fVar75 - fVar142) * auVar137._12_4_;
            fVar102 = (fVar65 - fVar143) * auVar32._0_4_;
            fVar105 = (fVar65 - fVar144) * auVar32._4_4_;
            fVar106 = (fVar65 - fVar145) * auVar32._8_4_;
            fVar107 = (fVar65 - fVar146) * auVar32._12_4_;
            fVar75 = *(float *)(uVar18 + 0x60 + lVar5 * 4);
            fVar108 = (fVar75 - fVar147) * fVar119;
            fVar110 = (fVar75 - fVar148) * fVar123;
            fVar111 = (fVar75 - fVar149) * fVar125;
            fVar112 = (fVar75 - fVar150) * fVar127;
            fVar76 = (fVar63 - fVar139) * auVar137._0_4_;
            fVar78 = (fVar63 - fVar140) * auVar137._4_4_;
            fVar80 = (fVar63 - fVar141) * auVar137._8_4_;
            fVar86 = (fVar63 - fVar142) * auVar137._12_4_;
            fVar63 = (fVar67 - fVar143) * auVar32._0_4_;
            fVar65 = (fVar67 - fVar144) * auVar32._4_4_;
            fVar69 = (fVar67 - fVar145) * auVar32._8_4_;
            fVar67 = (fVar67 - fVar146) * auVar32._12_4_;
            fVar75 = *(float *)(uVar18 + 0x70 + lVar5 * 4);
            fVar113 = (fVar75 - fVar147) * fVar119;
            fVar117 = (fVar75 - fVar148) * fVar123;
            fVar118 = (fVar75 - fVar149) * fVar125;
            fVar75 = (fVar75 - fVar150) * fVar127;
            uVar16 = (uint)((int)fVar76 < (int)fVar87) * (int)fVar76 |
                     (uint)((int)fVar76 >= (int)fVar87) * (int)fVar87;
            uVar64 = (uint)((int)fVar78 < (int)fVar99) * (int)fVar78 |
                     (uint)((int)fVar78 >= (int)fVar99) * (int)fVar99;
            uVar66 = (uint)((int)fVar80 < (int)fVar100) * (int)fVar80 |
                     (uint)((int)fVar80 >= (int)fVar100) * (int)fVar100;
            uVar68 = (uint)((int)fVar86 < (int)fVar101) * (int)fVar86 |
                     (uint)((int)fVar86 >= (int)fVar101) * (int)fVar101;
            uVar70 = (uint)((int)fVar63 < (int)fVar102) * (int)fVar63 |
                     (uint)((int)fVar63 >= (int)fVar102) * (int)fVar102;
            uVar77 = (uint)((int)fVar65 < (int)fVar105) * (int)fVar65 |
                     (uint)((int)fVar65 >= (int)fVar105) * (int)fVar105;
            uVar79 = (uint)((int)fVar69 < (int)fVar106) * (int)fVar69 |
                     (uint)((int)fVar69 >= (int)fVar106) * (int)fVar106;
            uVar81 = (uint)((int)fVar67 < (int)fVar107) * (int)fVar67 |
                     (uint)((int)fVar67 >= (int)fVar107) * (int)fVar107;
            uVar129 = ((int)uVar70 < (int)uVar16) * uVar16 | ((int)uVar70 >= (int)uVar16) * uVar70;
            uVar133 = ((int)uVar77 < (int)uVar64) * uVar64 | ((int)uVar77 >= (int)uVar64) * uVar77;
            uVar134 = ((int)uVar79 < (int)uVar66) * uVar66 | ((int)uVar79 >= (int)uVar66) * uVar79;
            uVar135 = ((int)uVar81 < (int)uVar68) * uVar68 | ((int)uVar81 >= (int)uVar68) * uVar81;
            uVar16 = (uint)((int)fVar113 < (int)fVar108) * (int)fVar113 |
                     (uint)((int)fVar113 >= (int)fVar108) * (int)fVar108;
            uVar64 = (uint)((int)fVar117 < (int)fVar110) * (int)fVar117 |
                     (uint)((int)fVar117 >= (int)fVar110) * (int)fVar110;
            uVar66 = (uint)((int)fVar118 < (int)fVar111) * (int)fVar118 |
                     (uint)((int)fVar118 >= (int)fVar111) * (int)fVar111;
            uVar68 = (uint)((int)fVar75 < (int)fVar112) * (int)fVar75 |
                     (uint)((int)fVar75 >= (int)fVar112) * (int)fVar112;
            uVar120 = (uint)((int)uVar16 < (int)local_1138._0_4_) * local_1138._0_4_ |
                      ((int)uVar16 >= (int)local_1138._0_4_) * uVar16;
            uVar124 = (uint)((int)uVar64 < (int)local_1138._4_4_) * local_1138._4_4_ |
                      ((int)uVar64 >= (int)local_1138._4_4_) * uVar64;
            uVar126 = (uint)((int)uVar66 < (int)local_1138._8_4_) * local_1138._8_4_ |
                      ((int)uVar66 >= (int)local_1138._8_4_) * uVar66;
            uVar128 = (uint)((int)uVar68 < (int)local_1138._12_4_) * local_1138._12_4_ |
                      ((int)uVar68 >= (int)local_1138._12_4_) * uVar68;
            uVar70 = (uint)((int)fVar76 < (int)fVar87) * (int)fVar87 |
                     (uint)((int)fVar76 >= (int)fVar87) * (int)fVar76;
            uVar77 = (uint)((int)fVar78 < (int)fVar99) * (int)fVar99 |
                     (uint)((int)fVar78 >= (int)fVar99) * (int)fVar78;
            uVar79 = (uint)((int)fVar80 < (int)fVar100) * (int)fVar100 |
                     (uint)((int)fVar80 >= (int)fVar100) * (int)fVar80;
            uVar81 = (uint)((int)fVar86 < (int)fVar101) * (int)fVar101 |
                     (uint)((int)fVar86 >= (int)fVar101) * (int)fVar86;
            uVar16 = (uint)((int)fVar63 < (int)fVar102) * (int)fVar102 |
                     (uint)((int)fVar63 >= (int)fVar102) * (int)fVar63;
            uVar64 = (uint)((int)fVar65 < (int)fVar105) * (int)fVar105 |
                     (uint)((int)fVar65 >= (int)fVar105) * (int)fVar65;
            uVar66 = (uint)((int)fVar69 < (int)fVar106) * (int)fVar106 |
                     (uint)((int)fVar69 >= (int)fVar106) * (int)fVar69;
            uVar68 = (uint)((int)fVar67 < (int)fVar107) * (int)fVar107 |
                     (uint)((int)fVar67 >= (int)fVar107) * (int)fVar67;
            uVar16 = ((int)uVar70 < (int)uVar16) * uVar70 | ((int)uVar70 >= (int)uVar16) * uVar16;
            uVar64 = ((int)uVar77 < (int)uVar64) * uVar77 | ((int)uVar77 >= (int)uVar64) * uVar64;
            uVar66 = ((int)uVar79 < (int)uVar66) * uVar79 | ((int)uVar79 >= (int)uVar66) * uVar66;
            uVar68 = ((int)uVar81 < (int)uVar68) * uVar81 | ((int)uVar81 >= (int)uVar68) * uVar68;
            uVar70 = (uint)((int)fVar113 < (int)fVar108) * (int)fVar108 |
                     (uint)((int)fVar113 >= (int)fVar108) * (int)fVar113;
            uVar77 = (uint)((int)fVar117 < (int)fVar110) * (int)fVar110 |
                     (uint)((int)fVar117 >= (int)fVar110) * (int)fVar117;
            uVar79 = (uint)((int)fVar118 < (int)fVar111) * (int)fVar111 |
                     (uint)((int)fVar118 >= (int)fVar111) * (int)fVar118;
            uVar81 = (uint)((int)fVar75 < (int)fVar112) * (int)fVar112 |
                     (uint)((int)fVar75 >= (int)fVar112) * (int)fVar75;
            uVar70 = (uint)(bi_9.field_0.i[0] < (int)uVar70) * bi_9.field_0.i[0] |
                     (bi_9.field_0.i[0] >= (int)uVar70) * uVar70;
            uVar77 = (uint)(bi_9.field_0.i[1] < (int)uVar77) * bi_9.field_0.i[1] |
                     (bi_9.field_0.i[1] >= (int)uVar77) * uVar77;
            uVar79 = (uint)(bi_9.field_0.i[2] < (int)uVar79) * bi_9.field_0.i[2] |
                     (bi_9.field_0.i[2] >= (int)uVar79) * uVar79;
            uVar81 = (uint)(bi_9.field_0.i[3] < (int)uVar81) * bi_9.field_0.i[3] |
                     (bi_9.field_0.i[3] >= (int)uVar81) * uVar81;
            auVar115._0_4_ =
                 (float)(((int)uVar16 < (int)uVar70) * uVar16 |
                        ((int)uVar16 >= (int)uVar70) * uVar70);
            auVar115._4_4_ =
                 (float)(((int)uVar64 < (int)uVar77) * uVar64 |
                        ((int)uVar64 >= (int)uVar77) * uVar77);
            auVar115._8_4_ =
                 (float)(((int)uVar66 < (int)uVar79) * uVar66 |
                        ((int)uVar66 >= (int)uVar79) * uVar79);
            auVar115._12_4_ =
                 (float)(((int)uVar68 < (int)uVar81) * uVar68 |
                        ((int)uVar68 >= (int)uVar81) * uVar81);
            auVar122._4_4_ =
                 -(uint)((float)(((int)uVar124 < (int)uVar133) * uVar133 |
                                ((int)uVar124 >= (int)uVar133) * uVar124) <= auVar115._4_4_);
            auVar122._0_4_ =
                 -(uint)((float)(((int)uVar120 < (int)uVar129) * uVar129 |
                                ((int)uVar120 >= (int)uVar129) * uVar120) <= auVar115._0_4_);
            auVar122._8_4_ =
                 -(uint)((float)(((int)uVar126 < (int)uVar134) * uVar134 |
                                ((int)uVar126 >= (int)uVar134) * uVar126) <= auVar115._8_4_);
            auVar122._12_4_ =
                 -(uint)((float)(((int)uVar128 < (int)uVar135) * uVar135 |
                                ((int)uVar128 >= (int)uVar135) * uVar128) <= auVar115._12_4_);
            uVar16 = movmskps((int)valid_i,auVar122);
            valid_i = (vint<4> *)(ulong)uVar16;
            uVar20 = uVar19;
            if (uVar16 != 0) {
              fVar75 = fmin.field_0.v[lVar5];
              auVar82 = ZEXT416((uint)fVar75);
              uVar20 = *(ulong *)(uVar18 + lVar5 * 8);
              auVar98._4_4_ = -(uint)(fVar75 < auVar152._4_4_);
              auVar98._0_4_ = -(uint)(fVar75 < auVar152._0_4_);
              auVar98._8_4_ = -(uint)(fVar75 < auVar152._8_4_);
              auVar98._12_4_ = -(uint)(fVar75 < auVar152._12_4_);
              uVar16 = movmskps(uVar16,auVar98);
              valid_i = (vint<4> *)(ulong)uVar16;
              if (uVar16 == 0) {
                (pSVar23->ptr).ptr = uVar20;
                uVar20 = uVar19;
              }
              else {
                if (uVar19 == 8) {
                  auVar152._8_4_ = fVar75;
                  auVar152._0_8_ = CONCAT44(fVar75,fVar75);
                  auVar152._12_4_ = fVar75;
                  goto LAB_00730512;
                }
                (pSVar23->ptr).ptr = uVar19;
                auVar153._8_4_ = fVar75;
                auVar153._0_8_ = CONCAT44(fVar75,fVar75);
                auVar153._12_4_ = fVar75;
                auVar82 = auVar152;
                auVar152 = auVar153;
              }
              uVar26 = uVar26 + 1;
              pSVar23->dist = auVar82._0_4_;
              pSVar23 = pSVar23 + 1;
            }
LAB_00730512:
            local_11a8.context = (RTCRayQueryContext *)(uVar28 - 1);
            uVar28 = uVar28 & (ulong)local_11a8.context;
            uVar19 = uVar20;
          } while (uVar28 != 0);
          if (uVar20 == 8) goto LAB_007302db;
          uVar18 = uVar20;
          if (1 < uVar26) {
            pSVar1 = pSVar23 + -2;
            local_11a8.geometryUserPtr._0_4_ = pSVar23[-2].dist;
            local_11a8.context = (RTCRayQueryContext *)(pSVar23 + -1);
            if ((uint)local_11a8.geometryUserPtr < pSVar23[-1].dist) {
              sVar14 = (pSVar1->ptr).ptr;
              uVar15 = *(undefined8 *)&pSVar23[-2].dist;
              pSVar23[-2].dist = pSVar23[-1].dist;
              (pSVar1->ptr).ptr =
                   (((StackItemT<embree::NodeRefPtr<4>_> *)local_11a8.context)->ptr).ptr;
              (((StackItemT<embree::NodeRefPtr<4>_> *)local_11a8.context)->ptr).ptr = sVar14;
              local_11a8.geometryUserPtr._0_4_ = (uint)uVar15;
              pSVar23[-1].dist = (uint)local_11a8.geometryUserPtr;
            }
            valid_i = (vint<4> *)(ulong)(uint)local_11a8.geometryUserPtr;
            if (uVar26 != 2) {
              pSVar2 = pSVar23 + -3;
              uVar16 = pSVar23[-3].dist;
              if (uVar16 < pSVar23[-1].dist) {
                sVar14 = (pSVar2->ptr).ptr;
                uVar15 = *(undefined8 *)&pSVar23[-3].dist;
                pSVar23[-3].dist = pSVar23[-1].dist;
                (pSVar2->ptr).ptr =
                     (((StackItemT<embree::NodeRefPtr<4>_> *)local_11a8.context)->ptr).ptr;
                (((StackItemT<embree::NodeRefPtr<4>_> *)local_11a8.context)->ptr).ptr = sVar14;
                local_11a8.geometryUserPtr._0_4_ = (uint)uVar15;
                pSVar23[-1].dist = (uint)local_11a8.geometryUserPtr;
                uVar16 = pSVar23[-3].dist;
              }
              valid_i = (vint<4> *)(ulong)uVar16;
              if (uVar16 < pSVar23[-2].dist) {
                sVar14 = (pSVar2->ptr).ptr;
                uVar19 = *(ulong *)&pSVar23[-3].dist;
                pSVar23[-3].dist = pSVar23[-2].dist;
                (pSVar2->ptr).ptr = (pSVar1->ptr).ptr;
                (pSVar1->ptr).ptr = sVar14;
                local_11a8.geometryUserPtr._0_4_ = (uint)uVar19;
                local_11a8.context = (RTCRayQueryContext *)(uVar19 & 0xffffffff);
                pSVar23[-2].dist = (uint)local_11a8.geometryUserPtr;
              }
            }
          }
        }
        auVar61._4_4_ = -(uint)(auVar152._4_4_ < (float)bi_9.field_0.i[1]);
        auVar61._0_4_ = -(uint)(auVar152._0_4_ < (float)bi_9.field_0.i[0]);
        auVar61._8_4_ = -(uint)(auVar152._8_4_ < (float)bi_9.field_0.i[2]);
        auVar61._12_4_ = -(uint)(auVar152._12_4_ < (float)bi_9.field_0.i[3]);
        iVar17 = movmskps((uint)uVar18,auVar61);
      } while (iVar17 == 0);
      pGVar21 = (Geometry *)((ulong)((uint)uVar18 & 0xf) - 8);
      local_1048 = auVar61;
      local_1178 = pGVar21;
      for (pGVar27 = (Geometry *)0x0; pGVar21 != pGVar27;
          pGVar27 = (Geometry *)((long)&(pGVar27->super_RefCount)._vptr_RefCount + 1)) {
        local_11a8.geomID = *(uint *)((uVar18 & 0xfffffffffffffff0) + (long)pGVar27 * 8);
        valid_i = (vint<4> *)(ulong)local_11a8.geomID;
        local_1178 = (context->scene->geometries).items[(long)valid_i].ptr;
        uVar16 = local_1178->mask;
        auVar74._0_4_ = -(uint)((uVar16 & *(uint *)(ray + 0x90)) == 0);
        auVar74._4_4_ = -(uint)((uVar16 & *(uint *)(ray + 0x94)) == 0);
        auVar74._8_4_ = -(uint)((uVar16 & *(uint *)(ray + 0x98)) == 0);
        auVar74._12_4_ = -(uint)((uVar16 & *(uint *)(ray + 0x9c)) == 0);
        fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(~auVar74 & auVar61);
        uVar16 = movmskps((int)local_11a8.context,(undefined1  [16])fmin.field_0);
        local_11a8.context = (RTCRayQueryContext *)(ulong)uVar16;
        if (uVar16 != 0) {
          local_11a8.primID = *(uint *)((uVar18 & 0xfffffffffffffff0) + 4 + (long)pGVar27 * 8);
          local_11a8.valid = (int *)&fmin;
          local_11a8.geometryUserPtr = local_1178->userPtr;
          local_11a8.context = context->user;
          local_11a8.N = 4;
          local_1170 = 0;
          local_1168 = context->args;
          pp_Var22 = (_func_int **)local_1168->intersect;
          if (pp_Var22 == (_func_int **)0x0) {
            pp_Var22 = local_1178[1].super_RefCount._vptr_RefCount;
          }
          valid_i = (vint<4> *)&local_11a8;
          local_11a8.rayhit = (RTCRayHitN *)ray;
          local_1178 = (Geometry *)(*(code *)pp_Var22)((RTCIntersectFunctionNArguments *)valid_i);
          auVar61 = local_1048;
          auVar137 = local_1098;
          auVar32 = local_10a8;
          fVar139 = local_1058;
          fVar140 = fStack_1054;
          fVar141 = fStack_1050;
          fVar142 = fStack_104c;
          fVar143 = local_1068;
          fVar144 = fStack_1064;
          fVar145 = fStack_1060;
          fVar146 = fStack_105c;
          fVar147 = local_1078;
          fVar148 = fStack_1074;
          fVar149 = fStack_1070;
          fVar150 = fStack_106c;
          fVar119 = local_1088;
          fVar123 = fStack_1084;
          fVar125 = fStack_1080;
          fVar127 = fStack_107c;
        }
      }
      auVar82 = *(undefined1 (*) [16])(ray + 0x80);
      auVar85._0_4_ = -(uint)(auVar82._0_4_ < (float)bi_9.field_0.i[0]) & auVar61._0_4_;
      auVar85._4_4_ = -(uint)(auVar82._4_4_ < (float)bi_9.field_0.i[1]) & auVar61._4_4_;
      auVar85._8_4_ = -(uint)(auVar82._8_4_ < (float)bi_9.field_0.i[2]) & auVar61._8_4_;
      auVar85._12_4_ = -(uint)(auVar82._12_4_ < (float)bi_9.field_0.i[3]) & auVar61._12_4_;
      iVar17 = movmskps((int)local_1178,auVar85);
    } while (iVar17 == 0);
    bi_9.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                   blendvps((undefined1  [16])bi_9.field_0,auVar82,auVar61);
    auVar62._4_4_ = bi_9.field_0._0_4_;
    auVar62._0_4_ = bi_9.field_0._4_4_;
    auVar62._8_4_ = bi_9.field_0._12_4_;
    auVar62._12_4_ = bi_9.field_0._8_4_;
    auVar82 = maxps(auVar62,(undefined1  [16])bi_9.field_0);
    auVar13._4_8_ = auVar115._8_8_;
    auVar13._0_4_ = auVar82._4_4_;
    auVar116._0_8_ = auVar13._0_8_ << 0x20;
    auVar116._8_4_ = auVar82._8_4_;
    auVar116._12_4_ = auVar82._12_4_;
    auVar114._8_8_ = auVar82._8_8_;
    auVar114._0_8_ = auVar116._8_8_;
    if (auVar82._8_4_ <= auVar82._0_4_) {
      auVar114._0_4_ = auVar82._0_4_;
    }
  } while( true );
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }